

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::addUTCDate(Builder *this,int64_t v)

{
  Builder *in_RSI;
  Builder *in_RDI;
  uint8_t vSize;
  uint8_t in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 8;
  reserve(in_RSI,CONCAT17(8,in_stack_ffffffffffffffe8));
  appendByteUnchecked(in_RDI,in_stack_ffffffffffffffdf);
  toUInt64((int64_t)in_RSI);
  appendLengthUnchecked<8ul>(in_RSI,CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void addUTCDate(int64_t v) {
    constexpr uint8_t vSize = sizeof(int64_t);  // is always 8
    reserve(1 + vSize);
    appendByteUnchecked(0x1c);
    appendLengthUnchecked<vSize>(toUInt64(v));
  }